

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_EncryptAes256Cbc2_Test::~CryptoUtil_EncryptAes256Cbc2_Test
          (CryptoUtil_EncryptAes256Cbc2_Test *this)

{
  CryptoUtil_EncryptAes256Cbc2_Test *this_local;
  
  ~CryptoUtil_EncryptAes256Cbc2_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256Cbc2) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData iv("33343536373839303132333435363738");
  ByteData byte_data = CryptoUtil::EncryptAes256Cbc(key.GetBytes(),
                                                    iv.GetBytes(),
                                                    "test test test test");
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2ef199bb7d160f94fc17fa5f01b220c630d6b19a5973f4b313868c921fc10d22");
}